

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_find_best_sub_pixel_tree_pruned_more
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  MV MVar5;
  MV MVar6;
  short sVar7;
  int16_t iVar8;
  int16_t iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint left_cost;
  uint right_cost;
  uint up_cost;
  uint down_cost;
  int iVar13;
  int iVar14;
  int *piVar15;
  int *piVar16;
  MACROBLOCKD *xd_00;
  MV in_ECX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  MV *in_R9;
  SubpelMvLimits *in_stack_00000008;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_00000010;
  int_mv *in_stack_00000018;
  int dummy;
  MV this_mv;
  int ic;
  int ir;
  int is_scaled;
  scale_factors *sf;
  uint besterr;
  int hstep;
  int iter;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  MV_COST_PARAMS *mv_cost_params;
  SubpelMvLimits *mv_limits;
  int *cost_list;
  int iters_per_step;
  int forced_stop;
  int allow_hp;
  MV diag_step_4;
  MV diag_step_2;
  MV diag_step;
  MV diag_mv;
  uint down;
  MV bottom_mv;
  uint up;
  MV top_mv;
  uint right;
  MV right_mv;
  uint left;
  int dummy_1;
  MV left_mv;
  MV diag_step_1;
  MV diag_mv_1;
  uint down_1;
  MV bottom_mv_1;
  uint up_1;
  MV top_mv_1;
  uint right_1;
  MV right_mv_1;
  uint left_1;
  int dummy_3;
  MV left_mv_1;
  MV diag_step_3;
  MV diag_mv_2;
  uint down_2;
  MV bottom_mv_2;
  uint up_2;
  MV top_mv_2;
  uint right_2;
  MV right_mv_2;
  uint left_2;
  int dummy_5;
  MV left_mv_2;
  MV diag_step_5;
  MV rev_mv_1;
  MV left_long_mv;
  MV right_long_mv;
  MV rev_mv;
  MV top_long_mv;
  MV bottom_long_mv;
  MV chess_mv_2;
  MV chess_mv_1;
  int dummy_2;
  int bc;
  int br;
  int tc;
  int tr;
  MV rev_mv_3;
  MV left_long_mv_1;
  MV right_long_mv_1;
  MV rev_mv_2;
  MV top_long_mv_1;
  MV bottom_long_mv_1;
  MV chess_mv_2_1;
  MV chess_mv_1_1;
  int dummy_4;
  int bc_1;
  int br_1;
  int tc_1;
  int tr_1;
  MV rev_mv_5;
  MV left_long_mv_2;
  MV right_long_mv_2;
  MV rev_mv_4;
  MV top_long_mv_2;
  MV bottom_long_mv_2;
  MV chess_mv_2_2;
  MV chess_mv_1_2;
  int dummy_6;
  int bc_2;
  int br_2;
  int tc_2;
  int tr_2;
  SubpelMvLimits *in_stack_fffffffffffffaa8;
  scale_factors *in_stack_fffffffffffffab0;
  MV_COST_PARAMS *in_stack_fffffffffffffab8;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_fffffffffffffac0;
  MV *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  AV1_COMMON *in_stack_fffffffffffffad8;
  MV local_514;
  short in_stack_fffffffffffffaf0;
  short in_stack_fffffffffffffaf2;
  int in_stack_fffffffffffffaf4;
  int in_stack_fffffffffffffaf8;
  MACROBLOCKD *sse1_00;
  undefined4 in_stack_fffffffffffffb08;
  int iVar17;
  int iVar18;
  int *piVar19;
  int *piVar20;
  int *piVar21;
  short local_48c;
  short sStack_48a;
  int local_488;
  MV local_344;
  short local_340;
  short local_33e;
  int local_33c;
  SubpelMvLimits *local_338;
  SUBPEL_SEARCH_VAR_PARAMS *local_330;
  undefined1 *local_328;
  int *local_320;
  int *local_318;
  int *local_310;
  int local_304;
  MV local_2e0;
  short local_2dc;
  short local_2da;
  uint local_2d8;
  short local_2d4;
  int16_t local_2d2;
  uint local_2d0;
  short local_2cc;
  int16_t local_2ca;
  uint local_2c8;
  int16_t local_2c4;
  short local_2c2;
  uint local_2c0;
  MV local_2bc;
  short local_2b8;
  short local_2b6;
  int local_2b4;
  SubpelMvLimits *local_2b0;
  SUBPEL_SEARCH_VAR_PARAMS *local_2a8;
  undefined1 *local_2a0;
  int *local_298;
  int *local_290;
  int *local_288;
  int local_27c;
  MV local_25c;
  MV local_258;
  short local_254;
  short local_252;
  uint local_250;
  short local_24c;
  int16_t local_24a;
  uint local_248;
  short local_244;
  int16_t local_242;
  uint local_240;
  int16_t local_23c;
  short local_23a;
  uint local_238;
  MV local_234;
  short local_230;
  short local_22e;
  int local_22c;
  SubpelMvLimits *local_228;
  SUBPEL_SEARCH_VAR_PARAMS *local_220;
  undefined1 *local_218;
  int *local_210;
  int *local_208;
  int *local_200;
  int local_1f4;
  MV local_1d8;
  MV local_1d4;
  undefined2 local_1d0;
  short local_1ce;
  short local_1cc;
  short local_1ca;
  short local_1c8;
  short local_1c6;
  short local_1c4;
  undefined2 local_1c2;
  short local_1c0;
  short local_1be;
  short local_1bc;
  short local_1ba;
  short local_1b8;
  short local_1b6;
  short local_1b4;
  short local_1b2;
  MV local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  SubpelMvLimits *local_198;
  SUBPEL_SEARCH_VAR_PARAMS *local_190;
  undefined1 *local_188;
  int *local_180;
  int *local_178;
  int *local_170;
  int local_164;
  MV local_148;
  undefined2 local_140;
  short local_13e;
  short local_13c;
  short local_13a;
  short local_138;
  short local_136;
  short local_134;
  undefined2 local_132;
  short local_130;
  short local_12e;
  short local_12c;
  short local_12a;
  short local_128;
  short local_126;
  short local_124;
  short local_122;
  MV local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  SubpelMvLimits *local_108;
  SUBPEL_SEARCH_VAR_PARAMS *local_100;
  undefined1 *local_f8;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  int local_d4;
  MV local_b8;
  MV local_b4;
  undefined2 local_b0;
  short local_ae;
  short local_ac;
  short local_aa;
  short local_a8;
  short local_a6;
  short local_a4;
  undefined2 local_a2;
  short local_a0;
  short local_9e;
  short local_9c;
  short local_9a;
  short local_98;
  short local_96;
  short local_94;
  short local_92;
  MV local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  SubpelMvLimits *local_78;
  SUBPEL_SEARCH_VAR_PARAMS *local_70;
  undefined1 *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  int local_44;
  MV local_28;
  MV local_24;
  
  iVar14 = *in_RDX;
  bVar1 = *(byte *)(in_RDX + 4);
  iVar4 = in_RDX[5];
  piVar21 = *(int **)(in_RDX + 2);
  piVar15 = in_RDX + 6;
  piVar16 = in_RDX + 10;
  piVar19 = in_RDX + 0x16;
  iVar18 = 0;
  iVar17 = 4;
  *in_R9 = in_ECX;
  iVar10 = is_intrabc_block((MB_MODE_INFO *)**(undefined8 **)(in_RDI + 0x1eb8));
  if (iVar10 == 0) {
    xd_00 = *(MACROBLOCKD **)(in_RDI + 0x1f08);
  }
  else {
    xd_00 = (MACROBLOCKD *)(in_RSI + 0x110);
  }
  sse1_00 = xd_00;
  iVar10 = av1_is_scaled(in_stack_fffffffffffffab0);
  if ((in_R8 == (int *)0x0) || (iVar10 != 0)) {
    in_stack_fffffffffffffab0 =
         (scale_factors *)CONCAT44((int)((ulong)in_stack_fffffffffffffab0 >> 0x20),iVar10);
    local_488 = setup_center_error_facade
                          ((MACROBLOCKD *)in_stack_fffffffffffffad8,
                           (AV1_COMMON *)
                           CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                           in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                           in_stack_fffffffffffffab8,(uint *)in_stack_fffffffffffffab0,
                           (int *)CONCAT44(in_stack_fffffffffffffaf4,
                                           CONCAT22(in_stack_fffffffffffffaf2,
                                                    in_stack_fffffffffffffaf0)),
                           in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffaa8 = in_stack_00000008;
  }
  else {
    local_488 = in_R8[1] + *in_R8;
    in_stack_00000008->col_min = in_R8[1];
    *(int *)&in_stack_00000010->vfp = in_R8[2];
  }
  if (bVar1 != 3) {
    iVar11 = check_repeated_mv_and_update(in_stack_00000018,*in_R9,iVar18);
    if (iVar11 == 0) {
      iVar18 = iVar18 + 1;
      local_48c = in_ECX.row;
      sStack_48a = in_ECX.col;
      iVar11 = iVar10;
      iVar13 = iVar17;
      piVar20 = piVar19;
      if (((((piVar21 == (int *)0x0) || (*piVar21 == 0x7fffffff)) || (piVar21[1] == 0x7fffffff)) ||
          ((piVar21[2] == 0x7fffffff || (piVar21[3] == 0x7fffffff)))) ||
         ((piVar21[4] == 0x7fffffff ||
          (iVar12 = is_cost_list_wellbehaved(piVar21), iVar11 = iVar10, iVar13 = iVar17,
          piVar20 = piVar19, iVar12 == 0)))) {
        local_330 = in_stack_00000010;
        local_338 = in_stack_00000008;
        local_340 = local_48c;
        sVar7 = (short)iVar13;
        local_33e = sStack_48a - sVar7;
        local_344.row = 0;
        local_344.col = 0;
        iVar10 = iVar11;
        iVar17 = iVar13;
        piVar19 = piVar20;
        local_33c = iVar11;
        local_328 = &stack0xfffffffffffffb0c;
        local_320 = piVar16;
        local_318 = piVar20;
        local_310 = piVar15;
        local_304 = iVar13;
        left_cost = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_344,
                                      in_stack_00000008,in_stack_00000010,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaf4,
                                               CONCAT22(in_stack_fffffffffffffaf2,
                                                        in_stack_fffffffffffffaf0)),
                                      (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),
                                      (uint *)sse1_00,
                                      (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                      (int *)CONCAT44(iVar18,iVar13),(int)piVar20);
        right_cost = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                       (MV *)CONCAT44(in_stack_fffffffffffffad4,local_33c),
                                       &local_344,local_338,local_330,
                                       (MV_COST_PARAMS *)
                                       CONCAT44(in_stack_fffffffffffffaf4,
                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                         in_stack_fffffffffffffaf0)),
                                       (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),
                                       (uint *)sse1_00,
                                       (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                       (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
        up_cost = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                    (MV *)CONCAT44(in_stack_fffffffffffffad4,local_33c),&local_344,
                                    local_338,local_330,
                                    (MV_COST_PARAMS *)
                                    CONCAT44(in_stack_fffffffffffffaf4,
                                             CONCAT22(in_stack_fffffffffffffaf2,
                                                      in_stack_fffffffffffffaf0)),
                                    (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),
                                    (uint *)sse1_00,
                                    (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                    (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
        down_cost = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffad4,local_33c),&local_344
                                      ,local_338,local_330,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaf4,
                                               CONCAT22(in_stack_fffffffffffffaf2,
                                                        in_stack_fffffffffffffaf0)),
                                      (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),
                                      (uint *)sse1_00,
                                      (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                      (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
        local_2e0 = get_best_diag_step(local_304,left_cost,right_cost,up_cost,down_cost);
        check_better_fast(xd_00,in_stack_fffffffffffffad8,
                          (MV *)CONCAT44(in_stack_fffffffffffffad4,local_33c),&local_344,local_338,
                          local_330,
                          (MV_COST_PARAMS *)
                          CONCAT44(in_stack_fffffffffffffaf4,
                                   CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)),
                          (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                          (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                          (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
        MVar6 = local_148;
        if (1 < iVar4) {
          local_148 = local_2e0;
          MVar6 = local_148;
          local_190 = in_stack_00000010;
          local_198 = in_stack_00000008;
          local_1a0 = (int)local_48c;
          local_1a4 = (int)sStack_48a;
          sVar2 = in_R9->row;
          local_1a8 = (int)sVar2;
          sVar3 = in_R9->col;
          local_1ac = (int)sVar3;
          local_1b0.row = 0;
          local_1b0.col = 0;
          local_148.row = local_2e0.row;
          local_148.col = local_2e0.col;
          iVar12 = (int)piVar19;
          local_19c = iVar11;
          local_188 = &stack0xfffffffffffffb0c;
          local_180 = piVar16;
          local_178 = piVar20;
          local_170 = piVar15;
          local_164 = iVar13;
          local_148 = MVar6;
          if ((local_1a0 == local_1a8) || (local_1a4 == local_1ac)) {
            if ((local_1a0 == local_1a8) && (local_1a4 != local_1ac)) {
              local_1bc = sVar2 + sVar7;
              local_1ba = sVar3 + local_148.col;
              local_1c0 = sVar2 - sVar7;
              local_1be = sVar3 + local_148.col;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_1b0,
                                in_stack_00000008,in_stack_00000010,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),iVar12);
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
              local_1c4 = (short)local_1a8 - local_148.row;
              local_1c2 = (undefined2)local_1ac;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
              MVar6 = local_148;
            }
            else if ((local_1a0 != local_1a8) && (local_1a4 == local_1ac)) {
              local_1c8 = sVar2 + local_148.row;
              local_1c6 = sVar3 + sVar7;
              local_1cc = sVar2 + local_148.row;
              local_1ca = sVar3 - sVar7;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_1b0,
                                in_stack_00000008,in_stack_00000010,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),iVar12);
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
              local_1d0 = (undefined2)local_1a8;
              local_1ce = (short)local_1ac - local_148.col;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
              MVar6 = local_148;
            }
          }
          else {
            local_1b2 = sVar3 + local_148.col;
            local_1b8 = sVar2 + local_148.row;
            local_1b6 = sVar3;
            local_1b4 = sVar2;
            check_better_fast(xd_00,in_stack_fffffffffffffad8,
                              (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_1b0,
                              in_stack_00000008,in_stack_00000010,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffaf4,
                                       CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)
                                      ),(uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),
                              (uint *)sse1_00,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                              (int *)CONCAT44(iVar18,iVar17),iVar12);
            check_better_fast(xd_00,in_stack_fffffffffffffad8,
                              (MV *)CONCAT44(in_stack_fffffffffffffad4,local_19c),&local_1b0,
                              local_198,local_190,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffaf4,
                                       CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)
                                      ),(uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),
                              (uint *)sse1_00,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                              (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
            MVar6 = local_148;
          }
        }
      }
      else {
        get_cost_surf_min((int *)in_stack_fffffffffffffac0,(int *)in_stack_fffffffffffffab8,
                          &in_stack_fffffffffffffab0->x_scale_fp,
                          (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
        if ((in_stack_fffffffffffffaf8 != 0) || (MVar6 = local_148, in_stack_fffffffffffffaf4 != 0))
        {
          in_stack_fffffffffffffaf0 = local_48c + (short)in_stack_fffffffffffffaf8 * (short)iVar17;
          in_stack_fffffffffffffaf2 = sStack_48a + (short)in_stack_fffffffffffffaf4 * (short)iVar17;
          local_514.row = 0;
          local_514.col = 0;
          check_better_fast(xd_00,in_stack_fffffffffffffad8,
                            (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar10),&local_514,
                            in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffaf4,
                                     CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)),
                            (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                            (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                            (int *)CONCAT44(iVar18,iVar17),(int)piVar19);
          MVar6 = local_148;
        }
      }
      local_148 = MVar6;
      iVar11 = iVar10;
      piVar21 = piVar19;
      MVar6 = local_b8;
      if (bVar1 < 2) {
        iVar11 = check_repeated_mv_and_update(in_stack_00000018,*in_R9,iVar18);
        if (iVar11 != 0) {
          return 0x7fffffff;
        }
        iVar18 = iVar18 + 1;
        iVar13 = iVar17 >> 1;
        MVar5 = *in_R9;
        local_2a8 = in_stack_00000010;
        local_2b0 = in_stack_00000008;
        local_25c.row = MVar5.row;
        iVar8 = local_25c.row;
        local_2b8 = local_25c.row;
        local_25c.col = MVar5.col;
        iVar9 = local_25c.col;
        sVar7 = (short)iVar13;
        local_2b6 = local_25c.col - sVar7;
        local_2bc.row = 0;
        local_2bc.col = 0;
        iVar11 = iVar10;
        iVar17 = iVar13;
        piVar21 = piVar19;
        local_2b4 = iVar10;
        local_2a0 = &stack0xfffffffffffffb0c;
        local_298 = piVar16;
        local_290 = piVar19;
        local_288 = piVar15;
        local_27c = iVar13;
        local_25c = MVar5;
        local_2c0 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar10),&local_2bc,
                                      in_stack_00000008,in_stack_00000010,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaf4,
                                               CONCAT22(in_stack_fffffffffffffaf2,
                                                        in_stack_fffffffffffffaf0)),
                                      (uint *)CONCAT44(iVar10,in_stack_fffffffffffffaf8),
                                      (uint *)sse1_00,
                                      (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                      (int *)CONCAT44(iVar18,iVar13),(int)piVar19);
        local_2c4 = local_25c.row;
        local_2c2 = local_25c.col + (short)local_27c;
        local_2c8 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffad4,local_2b4),&local_2bc
                                      ,local_2b0,local_2a8,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaf4,
                                               CONCAT22(in_stack_fffffffffffffaf2,
                                                        in_stack_fffffffffffffaf0)),
                                      (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),
                                      (uint *)sse1_00,
                                      (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                      (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
        local_2cc = local_25c.row - (short)local_27c;
        local_2ca = local_25c.col;
        local_2d0 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffad4,local_2b4),&local_2bc
                                      ,local_2b0,local_2a8,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaf4,
                                               CONCAT22(in_stack_fffffffffffffaf2,
                                                        in_stack_fffffffffffffaf0)),
                                      (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),
                                      (uint *)sse1_00,
                                      (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                      (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
        local_2d4 = local_25c.row + (short)local_27c;
        local_2d2 = local_25c.col;
        local_2d8 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffad4,local_2b4),&local_2bc
                                      ,local_2b0,local_2a8,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffaf4,
                                               CONCAT22(in_stack_fffffffffffffaf2,
                                                        in_stack_fffffffffffffaf0)),
                                      (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),
                                      (uint *)sse1_00,
                                      (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                      (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
        local_258 = get_best_diag_step(local_27c,local_2c0,local_2c8,local_2d0,local_2d8);
        local_2dc = local_25c.row + local_258.row;
        local_2da = local_25c.col + local_258.col;
        check_better_fast(xd_00,in_stack_fffffffffffffad8,
                          (MV *)CONCAT44(in_stack_fffffffffffffad4,local_2b4),&local_2bc,local_2b0,
                          local_2a8,
                          (MV_COST_PARAMS *)
                          CONCAT44(in_stack_fffffffffffffaf4,
                                   CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)),
                          (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                          (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                          (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
        MVar6 = local_b8;
        if (1 < iVar4) {
          local_b8 = local_258;
          MVar6 = local_b8;
          local_100 = in_stack_00000010;
          local_108 = in_stack_00000008;
          local_110 = (int)iVar8;
          local_114 = (int)iVar9;
          sVar2 = in_R9->row;
          local_118 = (int)sVar2;
          sVar3 = in_R9->col;
          local_11c = (int)sVar3;
          local_120.row = 0;
          local_120.col = 0;
          local_b8.row = local_258.row;
          local_b8.col = local_258.col;
          iVar12 = (int)piVar21;
          local_10c = iVar10;
          local_f8 = &stack0xfffffffffffffb0c;
          local_f0 = piVar16;
          local_e8 = piVar19;
          local_e0 = piVar15;
          local_d4 = iVar13;
          local_b8 = MVar6;
          local_b4 = MVar5;
          if ((local_110 == local_118) || (local_114 == local_11c)) {
            if ((local_110 == local_118) && (local_114 != local_11c)) {
              local_12c = sVar2 + sVar7;
              local_12a = sVar3 + local_b8.col;
              local_130 = sVar2 - sVar7;
              local_12e = sVar3 + local_b8.col;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar10),&local_120,
                                in_stack_00000008,in_stack_00000010,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),iVar12);
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
              local_134 = (short)local_118 - local_b8.row;
              local_132 = (undefined2)local_11c;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
              MVar6 = local_b8;
            }
            else if ((local_110 != local_118) && (local_114 == local_11c)) {
              local_138 = sVar2 + local_b8.row;
              local_136 = sVar3 + sVar7;
              local_13c = sVar2 + local_b8.row;
              local_13a = sVar3 - sVar7;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar10),&local_120,
                                in_stack_00000008,in_stack_00000010,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),iVar12);
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
              local_140 = (undefined2)local_118;
              local_13e = (short)local_11c - local_b8.col;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
              MVar6 = local_b8;
            }
          }
          else {
            local_122 = sVar3 + local_b8.col;
            local_128 = sVar2 + local_b8.row;
            local_126 = sVar3;
            local_124 = sVar2;
            check_better_fast(xd_00,in_stack_fffffffffffffad8,
                              (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar10),&local_120,
                              in_stack_00000008,in_stack_00000010,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffaf4,
                                       CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)
                                      ),(uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),
                              (uint *)sse1_00,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                              (int *)CONCAT44(iVar18,iVar17),iVar12);
            check_better_fast(xd_00,in_stack_fffffffffffffad8,
                              (MV *)CONCAT44(in_stack_fffffffffffffad4,local_10c),&local_120,
                              local_108,local_100,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffaf4,
                                       CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)
                                      ),(uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),
                              (uint *)sse1_00,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                              (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
            MVar6 = local_b8;
          }
        }
      }
      local_b8 = MVar6;
      if ((iVar14 != 0) && (bVar1 == 0)) {
        iVar14 = check_repeated_mv_and_update(in_stack_00000018,*in_R9,iVar18);
        if (iVar14 == 0) {
          iVar18 = iVar18 + 1;
          iVar17 = iVar17 >> 1;
          MVar6 = *in_R9;
          local_220 = in_stack_00000010;
          local_228 = in_stack_00000008;
          local_1d8.row = MVar6.row;
          iVar8 = local_1d8.row;
          local_230 = local_1d8.row;
          local_1d8.col = MVar6.col;
          iVar9 = local_1d8.col;
          sVar7 = (short)iVar17;
          local_22e = local_1d8.col - sVar7;
          local_234.row = 0;
          local_234.col = 0;
          iVar14 = iVar11;
          iVar10 = iVar17;
          piVar19 = piVar21;
          local_22c = iVar11;
          local_218 = &stack0xfffffffffffffb0c;
          local_210 = piVar16;
          local_208 = piVar21;
          local_200 = piVar15;
          local_1f4 = iVar17;
          local_1d8 = MVar6;
          local_238 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                        (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_234,
                                        in_stack_00000008,in_stack_00000010,
                                        (MV_COST_PARAMS *)
                                        CONCAT44(in_stack_fffffffffffffaf4,
                                                 CONCAT22(in_stack_fffffffffffffaf2,
                                                          in_stack_fffffffffffffaf0)),
                                        (uint *)CONCAT44(iVar11,in_stack_fffffffffffffaf8),
                                        (uint *)sse1_00,
                                        (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                        (int *)CONCAT44(iVar18,iVar17),(int)piVar21);
          local_23c = local_1d8.row;
          local_23a = local_1d8.col + (short)local_1f4;
          iVar13 = (int)piVar19;
          local_240 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                        (MV *)CONCAT44(in_stack_fffffffffffffad4,local_22c),
                                        &local_234,local_228,local_220,
                                        (MV_COST_PARAMS *)
                                        CONCAT44(in_stack_fffffffffffffaf4,
                                                 CONCAT22(in_stack_fffffffffffffaf2,
                                                          in_stack_fffffffffffffaf0)),
                                        (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),
                                        (uint *)sse1_00,
                                        (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                        (int *)CONCAT44(iVar18,iVar10),iVar13);
          local_244 = local_1d8.row - (short)local_1f4;
          local_242 = local_1d8.col;
          local_248 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                        (MV *)CONCAT44(in_stack_fffffffffffffad4,local_22c),
                                        &local_234,local_228,local_220,
                                        (MV_COST_PARAMS *)
                                        CONCAT44(in_stack_fffffffffffffaf4,
                                                 CONCAT22(in_stack_fffffffffffffaf2,
                                                          in_stack_fffffffffffffaf0)),
                                        (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),
                                        (uint *)sse1_00,
                                        (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                        (int *)CONCAT44(iVar18,iVar10),iVar13);
          local_24c = local_1d8.row + (short)local_1f4;
          local_24a = local_1d8.col;
          local_250 = check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                        (MV *)CONCAT44(in_stack_fffffffffffffad4,local_22c),
                                        &local_234,local_228,local_220,
                                        (MV_COST_PARAMS *)
                                        CONCAT44(in_stack_fffffffffffffaf4,
                                                 CONCAT22(in_stack_fffffffffffffaf2,
                                                          in_stack_fffffffffffffaf0)),
                                        (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),
                                        (uint *)sse1_00,
                                        (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                        (int *)CONCAT44(iVar18,iVar10),iVar13);
          local_1d4 = get_best_diag_step(local_1f4,local_238,local_240,local_248,local_250);
          local_254 = local_1d8.row + local_1d4.row;
          local_252 = local_1d8.col + local_1d4.col;
          check_better_fast(xd_00,in_stack_fffffffffffffad8,
                            (MV *)CONCAT44(in_stack_fffffffffffffad4,local_22c),&local_234,local_228
                            ,local_220,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffaf4,
                                     CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0)),
                            (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                            (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                            (int *)CONCAT44(iVar18,iVar10),iVar13);
          if (1 < iVar4) {
            local_28 = local_1d4;
            MVar5 = local_28;
            local_70 = in_stack_00000010;
            local_78 = in_stack_00000008;
            local_80 = (int)iVar8;
            local_84 = (int)iVar9;
            local_94 = in_R9->row;
            local_88 = (int)local_94;
            local_96 = in_R9->col;
            local_8c = (int)local_96;
            local_90.row = 0;
            local_90.col = 0;
            local_28.row = local_1d4.row;
            local_28.col = local_1d4.col;
            local_7c = iVar11;
            local_68 = &stack0xfffffffffffffb0c;
            local_60 = piVar16;
            local_58 = piVar21;
            local_50 = piVar15;
            local_44 = iVar17;
            local_28 = MVar5;
            local_24 = MVar6;
            if ((local_80 == local_88) || (local_84 == local_8c)) {
              if ((local_80 == local_88) && (local_84 != local_8c)) {
                local_9c = local_94 + sVar7;
                local_9a = local_96 + local_28.col;
                local_a0 = local_94 - sVar7;
                local_9e = local_96 + local_28.col;
                check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                  (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_90,
                                  in_stack_00000008,in_stack_00000010,
                                  (MV_COST_PARAMS *)
                                  CONCAT44(in_stack_fffffffffffffaf4,
                                           CONCAT22(in_stack_fffffffffffffaf2,
                                                    in_stack_fffffffffffffaf0)),
                                  (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00
                                  ,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                  (int *)CONCAT44(iVar18,iVar10),iVar13);
                check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                  (MV *)CONCAT44(in_stack_fffffffffffffad4,local_7c),&local_90,
                                  local_78,local_70,
                                  (MV_COST_PARAMS *)
                                  CONCAT44(in_stack_fffffffffffffaf4,
                                           CONCAT22(in_stack_fffffffffffffaf2,
                                                    in_stack_fffffffffffffaf0)),
                                  (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00
                                  ,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                  (int *)CONCAT44(iVar18,iVar10),iVar13);
                local_a4 = (short)local_88 - local_28.row;
                local_a2 = (undefined2)local_8c;
                check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                  (MV *)CONCAT44(in_stack_fffffffffffffad4,local_7c),&local_90,
                                  local_78,local_70,
                                  (MV_COST_PARAMS *)
                                  CONCAT44(in_stack_fffffffffffffaf4,
                                           CONCAT22(in_stack_fffffffffffffaf2,
                                                    in_stack_fffffffffffffaf0)),
                                  (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00
                                  ,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                  (int *)CONCAT44(iVar18,iVar10),iVar13);
              }
              else if ((local_80 != local_88) && (local_84 == local_8c)) {
                local_a8 = local_94 + local_28.row;
                local_a6 = local_96 + sVar7;
                local_ac = local_94 + local_28.row;
                local_aa = local_96 - sVar7;
                check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                  (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_90,
                                  in_stack_00000008,in_stack_00000010,
                                  (MV_COST_PARAMS *)
                                  CONCAT44(in_stack_fffffffffffffaf4,
                                           CONCAT22(in_stack_fffffffffffffaf2,
                                                    in_stack_fffffffffffffaf0)),
                                  (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00
                                  ,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                  (int *)CONCAT44(iVar18,iVar10),iVar13);
                check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                  (MV *)CONCAT44(in_stack_fffffffffffffad4,local_7c),&local_90,
                                  local_78,local_70,
                                  (MV_COST_PARAMS *)
                                  CONCAT44(in_stack_fffffffffffffaf4,
                                           CONCAT22(in_stack_fffffffffffffaf2,
                                                    in_stack_fffffffffffffaf0)),
                                  (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00
                                  ,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                  (int *)CONCAT44(iVar18,iVar10),iVar13);
                local_b0 = (undefined2)local_88;
                local_ae = (short)local_8c - local_28.col;
                check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                  (MV *)CONCAT44(in_stack_fffffffffffffad4,local_7c),&local_90,
                                  local_78,local_70,
                                  (MV_COST_PARAMS *)
                                  CONCAT44(in_stack_fffffffffffffaf4,
                                           CONCAT22(in_stack_fffffffffffffaf2,
                                                    in_stack_fffffffffffffaf0)),
                                  (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00
                                  ,(int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                  (int *)CONCAT44(iVar18,iVar10),iVar13);
              }
            }
            else {
              local_92 = local_96 + local_28.col;
              local_98 = local_94 + local_28.row;
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,iVar11),&local_90,
                                in_stack_00000008,in_stack_00000010,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar10),iVar13);
              check_better_fast(xd_00,in_stack_fffffffffffffad8,
                                (MV *)CONCAT44(in_stack_fffffffffffffad4,local_7c),&local_90,
                                local_78,local_70,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffaf4,
                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                  in_stack_fffffffffffffaf0)),
                                (uint *)CONCAT44(iVar14,in_stack_fffffffffffffaf8),(uint *)sse1_00,
                                (int *)CONCAT44(local_488,in_stack_fffffffffffffb08),
                                (int *)CONCAT44(iVar18,iVar10),iVar13);
            }
          }
        }
        else {
          local_488 = 0x7fffffff;
        }
      }
    }
    else {
      local_488 = 0x7fffffff;
    }
  }
  return local_488;
}

Assistant:

int av1_find_best_sub_pixel_tree_pruned_more(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)cm;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const int *cost_list = ms_params->cost_list;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;

  // The iteration we are current searching for. Iter 0 corresponds to fullpel
  // mv, iter 1 to half pel, and so on
  int iter = 0;
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel
  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    besterr =
        setup_center_error_facade(xd, cm, bestmv, var_params, mv_cost_params,
                                  sse1, distortion, is_scaled);
  }

  // If forced_stop is FULL_PEL, return.
  if (forced_stop == FULL_PEL) return besterr;

  if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
    return INT_MAX;
  }
  iter++;

  if (cost_list && cost_list[0] != INT_MAX && cost_list[1] != INT_MAX &&
      cost_list[2] != INT_MAX && cost_list[3] != INT_MAX &&
      cost_list[4] != INT_MAX && is_cost_list_wellbehaved(cost_list)) {
    int ir, ic;
    get_cost_surf_min(cost_list, &ir, &ic, 1);
    if (ir != 0 || ic != 0) {
      const MV this_mv = { start_mv.row + ir * hstep,
                           start_mv.col + ic * hstep };
      int dummy = 0;
      check_better_fast(xd, cm, &this_mv, bestmv, mv_limits, var_params,
                        mv_cost_params, &besterr, sse1, distortion, &dummy,
                        is_scaled);
    }
  } else {
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  // Each subsequent iteration checks at least one point in common with
  // the last iteration could be 2 ( if diag selected) 1/4 pel
  if (forced_stop < HALF_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  if (allow_hp && forced_stop == EIGHTH_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  return besterr;
}